

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gitlike.cxx
# Opt level: O2

void Add(string *progname,const_iterator beginargs,const_iterator endargs)

{
  char cVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *spec;
  pointer pbVar3;
  long lVar4;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  allocator local_a62;
  allocator local_a61;
  ParseError e;
  string local_a38;
  string local_a18;
  PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
  pathspec;
  Flag refresh;
  Flag verbose;
  Flag dryrun;
  HelpFlag help;
  ArgumentParser parser;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"In Add");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&help,"",(allocator *)&verbose);
  dryrun.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&dryrun.super_FlagBase.super_NamedBase.super_Base.help;
  dryrun.super_FlagBase.super_NamedBase.super_Base.options = None;
  dryrun.super_FlagBase.super_NamedBase.super_Base.matched = false;
  dryrun.super_FlagBase.super_NamedBase.super_Base._13_3_ = 0;
  dryrun.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p._0_1_ = 0;
  args::ArgumentParser::ArgumentParser(&parser,(string *)&help,(string *)&dryrun);
  std::__cxx11::string::~string((string *)&dryrun);
  std::__cxx11::string::~string((string *)&help);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&help,progname
                 ," add");
  std::__cxx11::string::_M_assign((string *)&parser.helpParams.programName);
  std::__cxx11::string::~string((string *)&help);
  std::__cxx11::string::string((string *)&refresh,"help",(allocator *)&e);
  std::__cxx11::string::string((string *)&pathspec,"Display this help menu",(allocator *)&local_a38)
  ;
  verbose.super_FlagBase.super_NamedBase.super_Base._8_8_ =
       &verbose.super_FlagBase.super_NamedBase.super_Base.help._M_string_length;
  verbose.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_2_ = 0x6801;
  verbose.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p = (pointer)0x0;
  verbose.super_FlagBase.super_NamedBase.super_Base.help._M_string_length._0_1_ = 0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)
             ((long)&verbose.super_FlagBase.super_NamedBase.super_Base.help.field_2 + 8),"help");
  in._M_len = 2;
  in._M_array = (iterator)&verbose;
  args::Matcher::Matcher((Matcher *)&dryrun,in);
  args::HelpFlag::HelpFlag
            (&help,(Group *)&parser,(string *)&refresh,(string *)&pathspec,(Matcher *)&dryrun,None);
  args::Matcher::~Matcher((Matcher *)&dryrun);
  lVar4 = 0x30;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&verbose.super_FlagBase.super_NamedBase.super_Base._vptr_Base + lVar4));
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&pathspec);
  std::__cxx11::string::~string((string *)&refresh);
  std::__cxx11::string::string((string *)&pathspec,"dryrun",(allocator *)&local_a38);
  std::__cxx11::string::string((string *)&e,"dry run",(allocator *)&local_a18);
  refresh.super_FlagBase.super_NamedBase.super_Base._8_8_ =
       &refresh.super_FlagBase.super_NamedBase.super_Base.help._M_string_length;
  refresh.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_2_ = 0x6e01;
  refresh.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p = (pointer)0x0;
  refresh.super_FlagBase.super_NamedBase.super_Base.help._M_string_length._0_1_ = 0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)
             ((long)&refresh.super_FlagBase.super_NamedBase.super_Base.help.field_2 + 8),"dry-run");
  in_00._M_len = 2;
  in_00._M_array = (iterator)&refresh;
  args::Matcher::Matcher((Matcher *)&verbose,in_00);
  args::Flag::Flag(&dryrun,(Group *)&parser,(string *)&pathspec,(string *)&e,(Matcher *)&verbose,
                   None);
  args::Matcher::~Matcher((Matcher *)&verbose);
  lVar4 = 0x30;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&refresh.super_FlagBase.super_NamedBase.super_Base._vptr_Base + lVar4));
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&pathspec);
  std::__cxx11::string::string((string *)&e,"verbose",(allocator *)&local_a18);
  std::__cxx11::string::string((string *)&local_a38,"be verbose",&local_a62);
  pathspec.super_PositionalBase.super_NamedBase.super_Base._8_8_ =
       &pathspec.super_PositionalBase.super_NamedBase.super_Base.help._M_string_length;
  pathspec.super_PositionalBase.super_NamedBase.super_Base._vptr_Base._0_2_ = 0x7601;
  pathspec.super_PositionalBase.super_NamedBase.super_Base.help._M_dataplus._M_p = (pointer)0x0;
  pathspec.super_PositionalBase.super_NamedBase.super_Base.help._M_string_length._0_1_ = 0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)
             ((long)&pathspec.super_PositionalBase.super_NamedBase.super_Base.help.field_2 + 8),
             "verbose");
  in_01._M_len = 2;
  in_01._M_array = (iterator)&pathspec;
  args::Matcher::Matcher((Matcher *)&refresh,in_01);
  args::Flag::Flag(&verbose,(Group *)&parser,(string *)&e,&local_a38,(Matcher *)&refresh,None);
  args::Matcher::~Matcher((Matcher *)&refresh);
  lVar4 = 0x30;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&pathspec.super_PositionalBase.super_NamedBase.super_Base._vptr_Base + lVar4))
    ;
    lVar4 = lVar4 + -0x28;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&local_a38);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::string((string *)&local_a38,"refresh",&local_a62);
  std::__cxx11::string::string((string *)&local_a18,"Don\'t add, only refresh the index",&local_a61)
  ;
  args::EitherFlag::EitherFlag((EitherFlag *)&e,"refresh");
  in_02._M_len = 1;
  in_02._M_array = (iterator)&e;
  args::Matcher::Matcher((Matcher *)&pathspec,in_02);
  args::Flag::Flag(&refresh,(Group *)&parser,&local_a38,&local_a18,(Matcher *)&pathspec,None);
  args::Matcher::~Matcher((Matcher *)&pathspec);
  std::__cxx11::string::~string((string *)&e.super_Error.field_0x8);
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&local_a38);
  std::__cxx11::string::string((string *)&e,"pathspec",&local_a62);
  std::__cxx11::string::string((string *)&local_a38,"pathspecs",&local_a61);
  local_a18._M_dataplus._M_p = (pointer)0x0;
  local_a18._M_string_length = 0;
  local_a18.field_2._M_allocated_capacity = 0;
  args::
  PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
  ::PositionalList(&pathspec,(Group *)&parser,(string *)&e,&local_a38,(Container *)&local_a18,None);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_a18);
  std::__cxx11::string::~string((string *)&local_a38);
  std::__cxx11::string::~string((string *)&e);
  args::ArgumentParser::
  ParseArgs<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&parser,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )beginargs._M_current,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )endargs._M_current);
  *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) | 1;
  poVar2 = std::operator<<((ostream *)&std::cout,"dryrun: ");
  (*dryrun.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"verbose: ");
  (**(code **)(CONCAT62(verbose.super_FlagBase.super_NamedBase.super_Base._vptr_Base._2_6_,
                        verbose.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_2_) + 0x10))
            ();
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"refresh: ");
  (**(code **)(CONCAT62(refresh.super_FlagBase.super_NamedBase.super_Base._vptr_Base._2_6_,
                        refresh.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_2_) + 0x10))
            ();
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"pathspec: ");
  (**(code **)(CONCAT62(pathspec.super_PositionalBase.super_NamedBase.super_Base._vptr_Base._2_6_,
                        pathspec.super_PositionalBase.super_NamedBase.super_Base._vptr_Base._0_2_) +
              0x10))();
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::endl<char,std::char_traits<char>>(poVar2);
  cVar1 = (**(code **)(CONCAT62(pathspec.super_PositionalBase.super_NamedBase.super_Base._vptr_Base.
                                _2_6_,pathspec.super_PositionalBase.super_NamedBase.super_Base.
                                      _vptr_Base._0_2_) + 0x10))();
  if (cVar1 != '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"values: ");
    std::endl<char,std::char_traits<char>>(poVar2);
    for (pbVar3 = pathspec.values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 != pathspec.values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout," - ");
      poVar2 = std::operator<<(poVar2,(string *)pbVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  args::
  PositionalList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::detail::vector,_args::ValueReader>
  ::~PositionalList(&pathspec);
  args::FlagBase::~FlagBase(&refresh.super_FlagBase);
  args::FlagBase::~FlagBase(&verbose.super_FlagBase);
  args::FlagBase::~FlagBase(&dryrun.super_FlagBase);
  args::FlagBase::~FlagBase((FlagBase *)&help);
  args::ArgumentParser::~ArgumentParser(&parser);
  return;
}

Assistant:

void Add(const std::string &progname, std::vector<std::string>::const_iterator beginargs, std::vector<std::string>::const_iterator endargs)
{
    std::cout << "In Add" << std::endl;
    args::ArgumentParser parser("");
    parser.Prog(progname + " add");
    args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
    args::Flag dryrun(parser, "dryrun", "dry run", {'n', "dry-run"});
    args::Flag verbose(parser, "verbose", "be verbose", {'v', "verbose"});
    args::Flag refresh(parser, "refresh", "Don't add, only refresh the index", {"refresh"});
    args::PositionalList<std::string> pathspec(parser, "pathspec", "pathspecs");
    try
    {
        parser.ParseArgs(beginargs, endargs);
        std::cout << std::boolalpha;
        std::cout << "dryrun: " << bool{dryrun} << std::endl;;
        std::cout << "verbose: " << bool{verbose} << std::endl;
        std::cout << "refresh: " << bool{refresh} << std::endl;
        std::cout << "pathspec: " << bool{pathspec} << std::endl;
        if (pathspec)
        {
            std::cout << "values: " << std::endl;
            for (const auto &spec: args::get(pathspec))
            {
                std::cout << " - " << spec << std::endl;
            }
        }
    }
    catch (args::Help)
    {
        std::cout << parser;
        return;
    }
    catch (args::ParseError e)
    {
        std::cerr << e.what() << std::endl;
        std::cerr << parser;
        return;
    }
}